

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O3

bool xmrig::NvmlLib::load(void)

{
  int iVar1;
  runtime_error *this;
  
  iVar1 = uv_dlsym(nvmlLib,"nvmlDeviceGetClockInfo",&pNvmlDeviceGetClockInfo);
  if (iVar1 == -1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"symbol not found");
  }
  else {
    iVar1 = uv_dlsym(nvmlLib,"nvmlDeviceGetCount_v2",&pNvmlDeviceGetCount);
    if (iVar1 == -1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"symbol not found");
    }
    else {
      iVar1 = uv_dlsym(nvmlLib,"nvmlDeviceGetFanSpeed",&pNvmlDeviceGetFanSpeed);
      if (iVar1 == -1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"symbol not found");
      }
      else {
        iVar1 = uv_dlsym(nvmlLib,"nvmlDeviceGetHandleByIndex_v2",&pNvmlDeviceGetHandleByIndex);
        if (iVar1 == -1) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"symbol not found");
        }
        else {
          iVar1 = uv_dlsym(nvmlLib,"nvmlDeviceGetPciInfo_v2",&pNvmlDeviceGetPciInfo);
          if (iVar1 == -1) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"symbol not found");
          }
          else {
            iVar1 = uv_dlsym(nvmlLib,"nvmlDeviceGetPowerUsage",&pNvmlDeviceGetPowerUsage);
            if (iVar1 == -1) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"symbol not found");
            }
            else {
              iVar1 = uv_dlsym(nvmlLib,"nvmlDeviceGetTemperature",&pNvmlDeviceGetTemperature);
              if (iVar1 == -1) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"symbol not found");
              }
              else {
                iVar1 = uv_dlsym(nvmlLib,"nvmlInit_v2",&pNvmlInit);
                if (iVar1 == -1) {
                  this = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this,"symbol not found");
                }
                else {
                  iVar1 = uv_dlsym(nvmlLib,"nvmlShutdown",&pNvmlShutdown);
                  if (iVar1 == -1) {
                    this = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this,"symbol not found");
                  }
                  else {
                    iVar1 = uv_dlsym(nvmlLib,"nvmlSystemGetDriverVersion",
                                     &pNvmlSystemGetDriverVersion);
                    if (iVar1 == -1) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this,"symbol not found");
                    }
                    else {
                      iVar1 = uv_dlsym(nvmlLib,"nvmlSystemGetNVMLVersion",&pNvmlSystemGetNVMLVersion
                                      );
                      if (iVar1 != -1) {
                        uv_dlsym(nvmlLib,"nvmlDeviceGetFanSpeed_v2",&pNvmlDeviceGetFanSpeed_v2);
                        iVar1 = (*pNvmlInit)();
                        if (iVar1 == 0) {
                          (*pNvmlSystemGetDriverVersion)(m_driverVersion,0x50);
                          (*pNvmlSystemGetNVMLVersion)(m_nvmlVersion,0x50);
                        }
                        return iVar1 == 0;
                      }
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this,"symbol not found");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool xmrig::NvmlLib::load()
{
    try {
        DLSYM(NvmlDeviceGetClockInfo);
        DLSYM(NvmlDeviceGetCount);
        DLSYM(NvmlDeviceGetFanSpeed);
        DLSYM(NvmlDeviceGetHandleByIndex);
        DLSYM(NvmlDeviceGetPciInfo);
        DLSYM(NvmlDeviceGetPowerUsage);
        DLSYM(NvmlDeviceGetTemperature);
        DLSYM(NvmlInit);
        DLSYM(NvmlShutdown);
        DLSYM(NvmlSystemGetDriverVersion);
        DLSYM(NvmlSystemGetNVMLVersion);
    } catch (std::exception &ex) {
        return false;
    }

    uv_dlsym(&nvmlLib, kNvmlDeviceGetFanSpeed_v2, reinterpret_cast<void**>(&pNvmlDeviceGetFanSpeed_v2));

    if (pNvmlInit() != NVML_SUCCESS) {
        return false;
    }

    pNvmlSystemGetDriverVersion(m_driverVersion, sizeof(m_driverVersion));
    pNvmlSystemGetNVMLVersion(m_nvmlVersion, sizeof(m_nvmlVersion));

    return true;
}